

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringWrapperExample.cpp
# Opt level: O0

ostream * toStringForMultipleLines(ostream *os,Rectangle3 *rectangle)

{
  ostream *poVar1;
  int *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"(x,y,width,height) = (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[3]);
  std::operator<<(poVar1,")");
  return in_RDI;
}

Assistant:

std::ostream& toStringForMultipleLines(std::ostream& os, const Rectangle3& rectangle)
{
    os << "(x,y,width,height) = (" << rectangle.x << "," << rectangle.y << ","
       << rectangle.width << "," << rectangle.height << ")";
    return os;
}